

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxBitOp::Resolve(FxBitOp *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  PType *pPVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  FxExpression *pFVar6;
  FxConstant *this_00;
  undefined4 uVar7;
  uint val;
  FxExpression *pFVar8;
  undefined4 uVar9;
  ExpVal local_38;
  undefined4 extraout_var_00;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar8 = (this->super_FxBinary).left;
  if (pFVar8 != (FxExpression *)0x0) {
    iVar5 = (*pFVar8->_vptr_FxExpression[2])(pFVar8,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  pFVar8 = (this->super_FxBinary).right;
  if (pFVar8 == (FxExpression *)0x0) {
LAB_0050e105:
    (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  ppFVar1 = &(this->super_FxBinary).right;
  iVar5 = (*pFVar8->_vptr_FxExpression[2])(pFVar8,ctx);
  pFVar6 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  (this->super_FxBinary).right = pFVar6;
  pFVar8 = (this->super_FxBinary).left;
  if ((pFVar8 == (FxExpression *)0x0) || (pFVar6 == (FxExpression *)0x0)) goto LAB_0050e105;
  pPVar2 = pFVar8->ValueType;
  if ((pPVar2 == (PType *)TypeBool) && (pFVar6->ValueType == pPVar2)) {
    (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
  }
  else {
    cVar3 = (**(code **)(*(long *)&pPVar2->super_PTypeBase + 0x40))(pPVar2);
    if ((cVar3 == '\0') ||
       (iVar5 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar5 == '\0')) {
      this_00 = (FxConstant *)0x0;
      FScriptPosition::Message
                (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
                 "Incompatible operands for bit operation");
      goto LAB_0050e12b;
    }
    bVar4 = FxBinary::Promote(&this->super_FxBinary,ctx,true);
    if (!bVar4) {
      return (FxExpression *)0x0;
    }
    pFVar8 = (this->super_FxBinary).left;
  }
  iVar5 = (*pFVar8->_vptr_FxExpression[3])();
  if ((char)iVar5 == '\0') {
    return (FxExpression *)this;
  }
  iVar5 = (*(*ppFVar1)->_vptr_FxExpression[3])();
  if ((char)iVar5 == '\0') {
    return (FxExpression *)this;
  }
  ExpVal::ExpVal(&local_38,(ExpVal *)((this->super_FxBinary).left + 1));
  if ((local_38.Type)->RegType == '\x01') {
    uVar9 = (undefined4)(double)CONCAT44(local_38.field_1._4_4_,local_38.field_1.Int);
  }
  else {
    uVar9 = 0;
    if ((local_38.Type)->RegType == '\0') {
      uVar9 = local_38.field_1.Int;
    }
  }
  ExpVal::~ExpVal(&local_38);
  pFVar8 = *ppFVar1 + 1;
  ExpVal::ExpVal(&local_38,(ExpVal *)pFVar8);
  if ((local_38.Type)->RegType == '\x01') {
    uVar7 = (undefined4)(double)CONCAT44(local_38.field_1._4_4_,local_38.field_1.Int);
  }
  else {
    uVar7 = 0;
    if ((local_38.Type)->RegType == '\0') {
      uVar7 = local_38.field_1.Int;
    }
  }
  ExpVal::~ExpVal(&local_38);
  this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pFVar8);
  iVar5 = (this->super_FxBinary).Operator;
  if (iVar5 == 0x7c) {
    val = uVar7 | uVar9;
  }
  else if (iVar5 == 0x26) {
    val = uVar7 & uVar9;
  }
  else {
    val = uVar7 ^ uVar9;
    if (iVar5 != 0x5e) {
      val = 0;
    }
  }
  FxConstant::FxConstant(this_00,val,&(this->super_FxBinary).super_FxExpression.ScriptPosition);
LAB_0050e12b:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxBitOp::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType == TypeBool && right->ValueType == TypeBool)
	{
		ValueType = TypeBool;
	}
	else if (left->IsNumeric() && right->IsNumeric())
	{
		if (!Promote(ctx, true)) return nullptr;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operands for bit operation");
		delete this;
		return nullptr;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
		int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();

		FxExpression *e = new FxConstant(
			Operator == '&'? v1 & v2 : 
			Operator == '|'? v1 | v2 : 
			Operator == '^'? v1 ^ v2 : 0, ScriptPosition);

		delete this;
		return e;
	}
	return this;
}